

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Error FT_Bitmap_Embolden(FT_Library library,FT_Bitmap *bitmap,FT_Pos xStrength,FT_Pos yStrength)

{
  byte bVar1;
  FT_UInt FVar2;
  FT_UInt FVar3;
  FT_Error FVar4;
  int iVar5;
  uchar *q;
  undefined1 local_80 [7];
  uchar tmp_1;
  FT_Bitmap tmp;
  FT_Int ystr;
  FT_Int xstr;
  FT_UInt y;
  FT_Int pitch;
  FT_Int x;
  FT_Int i;
  uchar *p;
  FT_Error error;
  FT_Pos yStrength_local;
  FT_Pos xStrength_local;
  FT_Bitmap *bitmap_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if ((bitmap == (FT_Bitmap *)0x0) || (bitmap->buffer == (uchar *)0x0)) {
    library_local._4_4_ = 6;
  }
  else if ((xStrength + 0x20 >> 6 < 0x80000000) && (yStrength + 0x20 >> 6 < 0x80000000)) {
    tmp.palette._4_4_ = (int)xStrength + 0x20 >> 6;
    tmp.palette._0_4_ = (int)yStrength + 0x20 >> 6;
    if ((tmp.palette._4_4_ == 0) && ((FT_UInt)tmp.palette == 0)) {
      library_local._4_4_ = 0;
    }
    else if (((int)tmp.palette._4_4_ < 0) || ((int)(FT_UInt)tmp.palette < 0)) {
      library_local._4_4_ = 6;
    }
    else {
      switch(bitmap->pixel_mode) {
      case '\x01':
        if (8 < (int)tmp.palette._4_4_) {
          tmp.palette._4_4_ = 8;
        }
        break;
      case '\x03':
      case '\x04':
        FT_Bitmap_Init((FT_Bitmap *)local_80);
        FVar4 = FT_Bitmap_Convert(library,bitmap,(FT_Bitmap *)local_80,1);
        if (FVar4 != 0) {
          return FVar4;
        }
        FT_Bitmap_Done(library,bitmap);
        memcpy(bitmap,local_80,0x28);
        break;
      case '\x05':
        tmp.palette._4_4_ = tmp.palette._4_4_ * 3;
        break;
      case '\x06':
        tmp.palette._0_4_ = (FT_UInt)tmp.palette * 3;
        break;
      case '\a':
        return 0;
      }
      library_local._4_4_ =
           ft_bitmap_assure_buffer(library->memory,bitmap,tmp.palette._4_4_,(FT_UInt)tmp.palette);
      if (library_local._4_4_ == 0) {
        xstr = bitmap->pitch;
        if (xstr < 1) {
          xstr = -xstr;
          _x = bitmap->buffer + xstr * (bitmap->rows - 1);
        }
        else {
          _x = bitmap->buffer + (int)(xstr * (FT_UInt)tmp.palette);
        }
        for (ystr = 0; FVar3 = xstr, (uint)ystr < bitmap->rows; ystr = ystr + 1) {
LAB_001d225e:
          FVar2 = FVar3;
          y = FVar2 - 1;
          if (-1 < (int)y) {
            bVar1 = _x[(int)y];
            for (pitch = 1; FVar3 = y, pitch <= (int)tmp.palette._4_4_; pitch = pitch + 1) {
              if (bitmap->pixel_mode == '\x01') {
                _x[(int)y] = _x[(int)y] | (byte)((int)(uint)bVar1 >> ((byte)pitch & 0x1f));
                if (0 < (int)y) {
                  _x[(int)y] = _x[(int)y] | _x[(int)(FVar2 - 2)] << (8 - (byte)pitch & 0x1f);
                }
              }
              else {
                FVar3 = y;
                if ((int)(y - pitch) < 0) break;
                if ((int)(bitmap->num_grays - 1) <
                    (int)((uint)_x[(int)y] + (uint)_x[(int)(y - pitch)])) {
                  _x[(int)y] = (char)bitmap->num_grays + 0xff;
                  FVar3 = y;
                  break;
                }
                _x[(int)y] = _x[(int)y] + _x[(int)(y - pitch)];
                FVar3 = y;
                if ((uint)_x[(int)y] == bitmap->num_grays - 1) break;
              }
            }
            goto LAB_001d225e;
          }
          for (y = 1; (int)y <= (int)(FT_UInt)tmp.palette; y = y + 1) {
            iVar5 = bitmap->pitch * y;
            for (pitch = 0; pitch < xstr; pitch = pitch + 1) {
              _x[(long)pitch - (long)iVar5] = _x[(long)pitch - (long)iVar5] | _x[pitch];
            }
          }
          _x = _x + bitmap->pitch;
        }
        bitmap->width = tmp.palette._4_4_ + bitmap->width;
        bitmap->rows = (FT_UInt)tmp.palette + bitmap->rows;
        library_local._4_4_ = 0;
      }
    }
  }
  else {
    library_local._4_4_ = 6;
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Embolden( FT_Library  library,
                      FT_Bitmap*  bitmap,
                      FT_Pos      xStrength,
                      FT_Pos      yStrength )
  {
    FT_Error        error;
    unsigned char*  p;
    FT_Int          i, x, pitch;
    FT_UInt         y;
    FT_Int          xstr, ystr;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !bitmap || !bitmap->buffer )
      return FT_THROW( Invalid_Argument );

    if ( ( ( FT_PIX_ROUND( xStrength ) >> 6 ) > FT_INT_MAX ) ||
         ( ( FT_PIX_ROUND( yStrength ) >> 6 ) > FT_INT_MAX ) )
      return FT_THROW( Invalid_Argument );

    xstr = (FT_Int)FT_PIX_ROUND( xStrength ) >> 6;
    ystr = (FT_Int)FT_PIX_ROUND( yStrength ) >> 6;

    if ( xstr == 0 && ystr == 0 )
      return FT_Err_Ok;
    else if ( xstr < 0 || ystr < 0 )
      return FT_THROW( Invalid_Argument );

    switch ( bitmap->pixel_mode )
    {
    case FT_PIXEL_MODE_GRAY2:
    case FT_PIXEL_MODE_GRAY4:
      {
        FT_Bitmap  tmp;


        /* convert to 8bpp */
        FT_Bitmap_Init( &tmp );
        error = FT_Bitmap_Convert( library, bitmap, &tmp, 1 );
        if ( error )
          return error;

        FT_Bitmap_Done( library, bitmap );
        *bitmap = tmp;
      }
      break;

    case FT_PIXEL_MODE_MONO:
      if ( xstr > 8 )
        xstr = 8;
      break;

    case FT_PIXEL_MODE_LCD:
      xstr *= 3;
      break;

    case FT_PIXEL_MODE_LCD_V:
      ystr *= 3;
      break;

    case FT_PIXEL_MODE_BGRA:
      /* We don't embolden color glyphs. */
      return FT_Err_Ok;
    }

    error = ft_bitmap_assure_buffer( library->memory, bitmap,
                                     (FT_UInt)xstr, (FT_UInt)ystr );
    if ( error )
      return error;

    /* take care of bitmap flow */
    pitch = bitmap->pitch;
    if ( pitch > 0 )
      p = bitmap->buffer + pitch * ystr;
    else
    {
      pitch = -pitch;
      p = bitmap->buffer + (FT_UInt)pitch * ( bitmap->rows - 1 );
    }

    /* for each row */
    for ( y = 0; y < bitmap->rows; y++ )
    {
      /*
       * Horizontally:
       *
       * From the last pixel on, make each pixel or'ed with the
       * `xstr' pixels before it.
       */
      for ( x = pitch - 1; x >= 0; x-- )
      {
        unsigned char  tmp;


        tmp = p[x];
        for ( i = 1; i <= xstr; i++ )
        {
          if ( bitmap->pixel_mode == FT_PIXEL_MODE_MONO )
          {
            p[x] |= tmp >> i;

            /* the maximum value of 8 for `xstr' comes from here */
            if ( x > 0 )
              p[x] |= p[x - 1] << ( 8 - i );

#if 0
            if ( p[x] == 0xFF )
              break;
#endif
          }
          else
          {
            if ( x - i >= 0 )
            {
              if ( p[x] + p[x - i] > bitmap->num_grays - 1 )
              {
                p[x] = (unsigned char)( bitmap->num_grays - 1 );
                break;
              }
              else
              {
                p[x] = (unsigned char)( p[x] + p[x - i] );
                if ( p[x] == bitmap->num_grays - 1 )
                  break;
              }
            }
            else
              break;
          }
        }
      }

      /*
       * Vertically:
       *
       * Make the above `ystr' rows or'ed with it.
       */
      for ( x = 1; x <= ystr; x++ )
      {
        unsigned char*  q;


        q = p - bitmap->pitch * x;
        for ( i = 0; i < pitch; i++ )
          q[i] |= p[i];
      }

      p += bitmap->pitch;
    }

    bitmap->width += (FT_UInt)xstr;
    bitmap->rows += (FT_UInt)ystr;

    return FT_Err_Ok;
  }